

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v8::detail::digit_grouping<char>::digit_grouping
          (digit_grouping<char> *this,locale_ref loc,bool localized)

{
  undefined7 in_register_00000011;
  thousands_sep_result<char> local_70;
  long *local_48 [2];
  long local_38 [2];
  char local_28;
  
  (this->sep_).grouping._M_dataplus._M_p = (pointer)&(this->sep_).grouping.field_2;
  (this->sep_).grouping._M_string_length = 0;
  (this->sep_).grouping.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,localized) == 0) {
    (this->sep_).thousands_sep = '\0';
  }
  else {
    thousands_sep_impl<char>(&local_70,loc);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_70.grouping._M_dataplus._M_p,
               local_70.grouping._M_dataplus._M_p + local_70.grouping._M_string_length);
    local_28 = local_70.thousands_sep;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.grouping._M_dataplus._M_p != &local_70.grouping.field_2) {
      operator_delete(local_70.grouping._M_dataplus._M_p,
                      local_70.grouping.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::operator=((string *)this,(string *)local_48);
    (this->sep_).thousands_sep = local_28;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return;
}

Assistant:

explicit digit_grouping(locale_ref loc, bool localized = true) {
    if (localized)
      sep_ = thousands_sep<Char>(loc);
    else
      sep_.thousands_sep = Char();
  }